

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataDevice.cpp
# Opt level: O1

int __thiscall
remote_wiring::FirmataDevice::_analogWrite(FirmataDevice *this,size_t pin_,size_t value_)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  iVar2 = 6;
  iVar4 = 6;
  if (pin_ < this->_pin_count) {
    if (this->_pin_info_cache != (WiringPinInfo *)0x0) {
      iVar2 = 0x5f;
      iVar4 = 0x5f;
      if (((ulong)this->_pin_info_cache[pin_] & 2) == 0) goto LAB_0010a0c4;
    }
    uVar1 = *(uint *)(this->_pin_state_cache + pin_);
    if ((char)uVar1 != '\x02') {
      *(uint *)(this->_pin_state_cache + pin_) = uVar1 & 0xffffff00 | 2;
      firmata::FirmataMarshaller::sendPinMode(&this->_marshaller,(uint8_t)pin_,'\x03');
    }
    firmata::FirmataMarshaller::sendAnalog(&this->_marshaller,(uint8_t)pin_,(uint16_t)value_);
    iVar2 = (*this->_stream->_vptr_Stream[3])();
    iVar4 = 0;
    if (iVar2 == 0) {
      return 0;
    }
  }
LAB_0010a0c4:
  piVar3 = __errno_location();
  *piVar3 = iVar2;
  return iVar4;
}

Assistant:

int
FirmataDevice::_analogWrite (
    const size_t pin_,
    const size_t value_
) {
    int error;

    if ( pin_ >= _pin_count ) {
        error = errno = ENXIO;
#ifdef LOG_ERRORS
        ::perror("FirmataDevice::analogWrite - Pin out of bounds!");
#endif
    } else if ( _pin_info_cache && !_pin_info_cache[pin_].analogWriteAvailable() ) {
        error = errno = EOPNOTSUPP;
#ifdef LOG_ERRORS
        ::perror("FirmataDevice::analogWrite - Pin incapable of analog write functionality!");
#endif
    } else if ( ANALOG_WRITE != _pin_state_cache[pin_].mode ) {
        error = 0;
        _pin_state_cache[pin_].mode = ANALOG_WRITE;
        _marshaller.sendPinMode(static_cast<uint8_t>(pin_), firmata::PIN_MODE_PWM);
        _marshaller.sendAnalog(static_cast<uint8_t>(pin_), value_);
        _stream.flush();
    } else {
        error = 0;
        _marshaller.sendAnalog(static_cast<uint8_t>(pin_), value_);
        _stream.flush();
    }

    return error;
}